

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::OneHotEncoder::OneHotEncoder(OneHotEncoder *this,OneHotEncoder *from)

{
  CategoryTypeCase CVar1;
  StringVector *this_00;
  StringVector *from_00;
  Int64Vector *this_01;
  Int64Vector *from_01;
  OneHotEncoder *from_local;
  OneHotEncoder *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__OneHotEncoder_006f9d28;
  CategoryTypeUnion::CategoryTypeUnion((CategoryTypeUnion *)&this->CategoryType_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  memcpy(&this->outputsparse_,&from->outputsparse_,(long)this + (0x18 - (long)&this->outputsparse_))
  ;
  clear_has_CategoryType(this);
  CVar1 = CategoryType_case(from);
  if (CVar1 != CATEGORYTYPE_NOT_SET) {
    if (CVar1 == kStringCategories) {
      this_00 = _internal_mutable_stringcategories(this);
      from_00 = _internal_stringcategories(from);
      StringVector::MergeFrom(this_00,from_00);
    }
    else if (CVar1 == kInt64Categories) {
      this_01 = _internal_mutable_int64categories(this);
      from_01 = _internal_int64categories(from);
      Int64Vector::MergeFrom(this_01,from_01);
    }
  }
  return;
}

Assistant:

OneHotEncoder::OneHotEncoder(const OneHotEncoder& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&outputsparse_, &from.outputsparse_,
    static_cast<size_t>(reinterpret_cast<char*>(&handleunknown_) -
    reinterpret_cast<char*>(&outputsparse_)) + sizeof(handleunknown_));
  clear_has_CategoryType();
  switch (from.CategoryType_case()) {
    case kStringCategories: {
      _internal_mutable_stringcategories()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringcategories());
      break;
    }
    case kInt64Categories: {
      _internal_mutable_int64categories()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64categories());
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.OneHotEncoder)
}